

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

BorderAmounts * __thiscall
CoreML::Specification::PaddingLayerParams::mutable_paddingamounts(PaddingLayerParams *this)

{
  BorderAmounts *this_00;
  
  this_00 = this->paddingamounts_;
  if (this_00 == (BorderAmounts *)0x0) {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00);
    this->paddingamounts_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::BorderAmounts* PaddingLayerParams::mutable_paddingamounts() {
  
  if (paddingamounts_ == NULL) {
    paddingamounts_ = new ::CoreML::Specification::BorderAmounts;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PaddingLayerParams.paddingAmounts)
  return paddingamounts_;
}